

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

bool __thiscall nuraft::raft_server::commit_in_bg_exec(raft_server *this,size_t timeout_ms)

{
  ulong idx_to_commit;
  ulong uVar1;
  element_type *peVar2;
  __int_type _Var3;
  element_type *peVar4;
  long *plVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  undefined4 extraout_var_00;
  __int_type _Var10;
  uint64_t uVar11;
  byte need_to_handle_commit_elem;
  bool bVar12;
  Param param;
  ptr<log_entry> le;
  uint64_t log_idx;
  ptr<cluster_config> cur_config;
  unique_lock<std::mutex> ll;
  timer_helper tt;
  undefined1 local_70 [16];
  code *local_60;
  code *local_58;
  ExecCommitAutoCleaner exec_auto_cleaner;
  undefined4 extraout_var;
  
  ll._M_device = &this->commit_lock_;
  ll._M_owns = std::mutex::try_lock(ll._M_device);
  bVar12 = true;
  if (ll._M_owns) {
    LOCK();
    (this->sm_commit_exec_in_progress_)._M_base._M_i = true;
    UNLOCK();
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx:179:25)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx:179:25)>
               ::_M_manager;
    local_70._0_8_ = this;
    std::function<void_()>::function(&exec_auto_cleaner.clean_func_,(function<void_()> *)local_70);
    std::_Function_base::~_Function_base((_Function_base *)local_70);
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 4 < iVar8)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&tt,"commit upto %lu, curruent idx %lu",
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
                 (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_in_bg_exec",0xb9,&tt);
      std::__cxx11::string::~string((string *)&tt);
    }
    iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[3])();
    lVar9 = CONCAT44(extraout_var,iVar8);
    if ((lVar9 != 0) &&
       (uVar1 = lVar9 - 1, (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i < uVar1)
       ) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 2 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&tt,
                   "current commit idx %lu is smaller than log start idx %lu - 1, adjust it to %lu",
                   (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i,lVar9,uVar1);
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg_exec",0xc2,&tt);
        std::__cxx11::string::~string((string *)&tt);
      }
      LOCK();
      (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = uVar1;
      UNLOCK();
    }
    get_config((raft_server *)&cur_config);
    if (((this->leader_).super___atomic_base<int>._M_i == this->id_) &&
       ((this->role_)._M_i == leader)) {
      need_to_handle_commit_elem =
           (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->async_replication_ ^ 1;
    }
    else {
      need_to_handle_commit_elem = false;
    }
    timer_helper::timer_helper(&tt,timeout_ms * 1000,false);
    bVar6 = 0;
    while( true ) {
      bVar12 = true;
      if (((this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i <=
           (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i) ||
         (uVar1 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i,
         iVar8 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])(), CONCAT44(extraout_var_00,iVar8) - 1U <= uVar1))
      goto LAB_0016716d;
      if ((!(bool)(~bVar6 & 1 | timeout_ms == 0)) && (bVar7 = timer_helper::timeout(&tt), bVar7))
      break;
      if (((this->sm_commit_paused_)._M_base._M_i & 1U) != 0) goto LAB_0016716d;
      _Var3 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      idx_to_commit = _Var3 + 1;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 5 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,"commit upto %lu, current idx %lu\n",
                   (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,idx_to_commit
                  );
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg_exec",0xdf,&param);
        std::__cxx11::string::~string((string *)&param);
      }
      peVar4 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar4->_vptr_log_store[10])(&le,peVar4,idx_to_commit);
      if (le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 0 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"failed to get log entry with idx %lu",idx_to_commit);
          (*peVar2->_vptr_logger[8])
                    (peVar2,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_in_bg_exec",0xe5,&param);
          std::__cxx11::string::~string((string *)&param);
        }
        plVar5 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar5 + 0x40))(plVar5,0xffffffffffffffed);
LAB_0016732d:
        exit(-1);
      }
      if ((le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->term_ == 0)
      {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 0 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"empty log at idx %lu, must be log corruption",idx_to_commit);
          (*peVar2->_vptr_logger[8])
                    (peVar2,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_in_bg_exec",0xf0,&param);
          std::__cxx11::string::~string((string *)&param);
        }
        plVar5 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar5 + 0x40))(plVar5,0xffffffffffffffed);
        goto LAB_0016732d;
      }
      if ((le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_type_
          == conf) {
        commit_conf(this,idx_to_commit,&le);
      }
      else if ((le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               value_type_ == app_log) {
        commit_app_log(this,idx_to_commit,&le,(bool)need_to_handle_commit_elem);
      }
      LOCK();
      _Var10 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      bVar12 = _Var3 == _Var10;
      if (bVar12) {
        (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = idx_to_commit;
        _Var10 = _Var3;
      }
      UNLOCK();
      if (bVar12) {
        snapshot_and_compact
                  (this,(this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i,false);
        param.myId = this->id_;
        param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
        param.peerId = -1;
        param.ctx = &log_idx;
        log_idx = idx_to_commit;
        cb_func::call(&((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                      StateMachineExecution,&param);
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 1 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,
                     "sm_commit_index_ has been changed from %lu to %lu, this thread attempted %lu",
                     _Var3,_Var10,idx_to_commit);
          (*peVar2->_vptr_logger[8])
                    (peVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_in_bg_exec",0x10b,&param);
          std::__cxx11::string::~string((string *)&param);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar6 = 1;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      bVar12 = false;
      goto LAB_001671d5;
    }
    iVar8 = (*peVar2->_vptr_logger[7])();
    if (2 < iVar8) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar11 = timer_helper::get_ms(&tt);
      msg_if_given_abi_cxx11_
                ((string *)&param,"abort commit due to timeout (%zu ms), %lu ms elapsed",timeout_ms,
                 uVar11);
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_in_bg_exec",0xd2,&param);
      std::__cxx11::string::~string((string *)&param);
    }
    bVar12 = false;
LAB_0016716d:
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 4 < iVar8)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&param,"DONE: commit upto %lu, curruent idx %lu",
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
                 (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_in_bg_exec",0x10f,&param);
      std::__cxx11::string::~string((string *)&param);
    }
LAB_001671d5:
    if ((this->role_)._M_i == follower) {
      uVar1 = (this->leader_commit_index_).super___atomic_base<unsigned_long>._M_i;
      _Var3 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      context::get_params((context *)&le);
      if ((((this->data_fresh_)._M_base._M_i & 1U) == 0) ||
         (uVar1 <= (long)*(int *)&le.
                                  super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr[1].field_0xc + _Var3)) {
        if ((((this->data_fresh_)._M_base._M_i & 1U) == 0) &&
           (uVar1 < _Var3 + (long)*(int *)&le.
                                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr[1].value_type_)) {
          LOCK();
          (this->data_fresh_)._M_base._M_i = true;
          UNLOCK();
          param.myId = this->id_;
          param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
          param.peerId = -1;
          param.ctx = (void *)0x0;
          cb_func::call(&((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                        BecomeFresh,&param);
        }
      }
      else {
        LOCK();
        (this->data_fresh_)._M_base._M_i = false;
        UNLOCK();
        param.myId = this->id_;
        param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
        param.peerId = -1;
        param.ctx = (void *)0x0;
        cb_func::call(&((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                      BecomeStale,&param);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    commit_in_bg_exec::ExecCommitAutoCleaner::~ExecCommitAutoCleaner(&exec_auto_cleaner);
  }
  std::unique_lock<std::mutex>::~unique_lock(&ll);
  return bVar12;
}

Assistant:

bool raft_server::commit_in_bg_exec(size_t timeout_ms) {
    std::unique_lock<std::mutex> ll(commit_lock_, std::try_to_lock);
    if (!ll.owns_lock()) {
        // Other thread is already doing commit.
        // This is caused by global workers only, as there is only one
        // thread running `commit_in_bg`. Raft server can request a new commit
        // while other worker is doing commit for that Raft server, and the
        // new request will be accepted since the global queue doesn't contain
        // the request for that Raft server (as it is popped by the worker).
        // In such a case, we can just ignore it.
        return true;
    }

    sm_commit_exec_in_progress_ = true;
    // Clear the flag automatically once we exit this function.
    struct ExecCommitAutoCleaner {
        ExecCommitAutoCleaner(std::function<void()> func) : clean_func_(func) {}
        ~ExecCommitAutoCleaner() { clean_func_(); }
        std::function<void()> clean_func_;
    } exec_auto_cleaner([this](){
        sm_commit_exec_in_progress_ = false;
        ea_sm_commit_exec_in_progress_->invoke();
    });

    p_db( "commit upto %" PRIu64 ", curruent idx %" PRIu64,
          quick_commit_index_.load(), sm_commit_index_.load() );

    ulong log_start_idx = log_store_->start_index();
    if ( log_start_idx &&
         sm_commit_index_ < log_start_idx - 1 ) {
        p_wn("current commit idx %" PRIu64 " is smaller than log start idx %" PRIu64 " - 1, "
             "adjust it to %" PRIu64 "",
             sm_commit_index_.load(),
             log_start_idx,
             log_start_idx - 1);
        sm_commit_index_ = log_start_idx - 1;
    }

    ptr<cluster_config> cur_config = get_config();
    bool need_to_handle_commit_elem = ( is_leader() &&
                                        !cur_config->is_async_replication() );

    bool first_loop_exec = true;
    bool finished_in_time = true;
    timer_helper tt(timeout_ms * 1000);
    while ( sm_commit_index_ < quick_commit_index_ &&
            sm_commit_index_ < log_store_->next_slot() - 1 ) {
        // NOTE: Skip timeout checking for the first loop execution.
        if (!first_loop_exec && timeout_ms && tt.timeout()) {
            p_wn( "abort commit due to timeout (%zu ms), %" PRIu64 " ms elapsed",
                  timeout_ms, tt.get_ms() );
            finished_in_time = false;
            break;
        }
        first_loop_exec = false;

        // Break the loop if state machine commit is paused.
        if (sm_commit_paused_) {
            break;
        }

        ulong index_to_commit = sm_commit_index_ + 1;
        p_tr( "commit upto %" PRIu64 ", current idx %" PRIu64 "\n",
              quick_commit_index_.load(), index_to_commit );

        ptr<log_entry> le = log_store_->entry_at(index_to_commit);
        if (!le)
        {
            // LCOV_EXCL_START
            p_ft( "failed to get log entry with idx %" PRIu64 "", index_to_commit );
            ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        if (le->get_term() == 0) {
            // LCOV_EXCL_START
            // Zero term means that log store is corrupted
            // (failed to read log).
            p_ft( "empty log at idx %" PRIu64 ", must be log corruption",
                  index_to_commit );
            ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        if (le->get_val_type() == log_val_type::app_log) {
            commit_app_log(index_to_commit, le, need_to_handle_commit_elem);

        } else if (le->get_val_type() == log_val_type::conf) {
            commit_conf(index_to_commit, le);
        }

        ulong exp_idx = index_to_commit - 1;
        if (sm_commit_index_.compare_exchange_strong(exp_idx, index_to_commit)) {
            snapshot_and_compact(sm_commit_index_);

            cb_func::Param param(id_, leader_);
            // Copy to other local variable to be safe.
            uint64_t log_idx = index_to_commit;
            param.ctx = &log_idx;
            ctx_->cb_func_.call(cb_func::StateMachineExecution, &param);
        } else {
            p_er("sm_commit_index_ has been changed from %" PRIu64 " to %" PRIu64 ", "
                 "this thread attempted %" PRIu64,
                 index_to_commit - 1,
                 exp_idx,
                 index_to_commit);
        }
    }
    p_db( "DONE: commit upto %" PRIu64 ", curruent idx %" PRIu64,
          quick_commit_index_.load(), sm_commit_index_.load() );
    if (role_ == srv_role::follower) {
        ulong leader_idx = leader_commit_index_.load();
        ulong local_idx = sm_commit_index_.load();
        ptr<raft_params> params = ctx_->get_params();

        if (data_fresh_.load() &&
            leader_idx > local_idx + params->stale_log_gap_) {
            data_fresh_.store(false);
            cb_func::Param param(id_, leader_);
            (void) ctx_->cb_func_.call(cb_func::BecomeStale, &param);

        } else if (!data_fresh_.load() &&
                   leader_idx < local_idx + params->fresh_log_gap_) {
            data_fresh_.store(true);
            cb_func::Param param(id_, leader_);
            (void) ctx_->cb_func_.call(cb_func::BecomeFresh, &param);
        }
    }
    return finished_in_time;
}